

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqrt.cc
# Opt level: O2

int BN_sqrt(BIGNUM *out_sqrt,BIGNUM *in,BN_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  BIGNUM *pBVar4;
  BIGNUM *dv;
  BIGNUM *r;
  BIGNUM *pBVar5;
  BIGNUM *pBVar6;
  bool bVar7;
  int line;
  uint uVar8;
  undefined1 auVar9 [16];
  
  if (in->neg == 0) {
    iVar2 = BN_is_zero(in);
    if (iVar2 == 0) {
      BN_CTX_start((BN_CTX *)ctx);
      pBVar4 = (BIGNUM *)out_sqrt;
      if (out_sqrt == in) {
        pBVar4 = BN_CTX_get((BN_CTX *)ctx);
      }
      dv = BN_CTX_get((BN_CTX *)ctx);
      r = BN_CTX_get((BN_CTX *)ctx);
      pBVar5 = BN_CTX_get((BN_CTX *)ctx);
      auVar9._0_4_ = -(uint)((int)((ulong)pBVar4 >> 0x20) == 0 && (int)pBVar4 == 0);
      auVar9._4_4_ = -(uint)((int)dv == 0 && (int)((ulong)dv >> 0x20) == 0);
      auVar9._8_4_ = -(uint)((int)((ulong)r >> 0x20) == 0 && (int)r == 0);
      auVar9._12_4_ = -(uint)((int)pBVar5 == 0 && (int)((ulong)pBVar5 >> 0x20) == 0);
      iVar2 = movmskps((int)pBVar5,auVar9);
      uVar8 = 0;
      if (iVar2 == 0) {
        pBVar6 = BN_value_one();
        uVar3 = BN_num_bits((BIGNUM *)in);
        iVar2 = BN_lshift(pBVar4,pBVar6,uVar3 >> 1);
        if (iVar2 != 0) {
          bVar1 = true;
          do {
            do {
              bVar7 = bVar1;
              pBVar6 = r;
              r = pBVar5;
              iVar2 = BN_div(dv,(BIGNUM *)0x0,(BIGNUM *)in,pBVar4,(BN_CTX *)ctx);
              if (iVar2 == 0) {
LAB_003d329f:
                iVar2 = 3;
                line = 0x3e;
                goto LAB_003d32b4;
              }
              iVar2 = BN_add(dv,dv,pBVar4);
              if (iVar2 == 0) goto LAB_003d329f;
              iVar2 = BN_rshift1(pBVar4,dv);
              if (iVar2 == 0) goto LAB_003d329f;
              iVar2 = BN_sqr(dv,pBVar4,(BN_CTX *)ctx);
              if (iVar2 == 0) goto LAB_003d329f;
              iVar2 = BN_sub(r,(BIGNUM *)in,dv);
              if (iVar2 == 0) goto LAB_003d329f;
              r->neg = 0;
              pBVar5 = pBVar6;
              bVar1 = false;
            } while (bVar7);
            iVar2 = BN_cmp(r,pBVar6);
            bVar1 = false;
          } while (iVar2 < 0);
          iVar2 = BN_cmp(dv,(BIGNUM *)in);
          if (iVar2 == 0) {
            if (out_sqrt == in) {
              pBVar4 = BN_copy((BIGNUM *)out_sqrt,pBVar4);
              uVar8 = (uint)(pBVar4 != (BIGNUM *)0x0);
            }
            else {
              uVar8 = 1;
            }
          }
          else {
            iVar2 = 0x6e;
            line = 0x52;
LAB_003d32b4:
            uVar8 = 0;
            ERR_put_error(3,0,iVar2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/sqrt.cc"
                          ,line);
          }
        }
      }
      BN_CTX_end((BN_CTX *)ctx);
    }
    else {
      BN_zero(out_sqrt);
      uVar8 = 1;
    }
  }
  else {
    uVar8 = 0;
    ERR_put_error(3,0,0x6d,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/sqrt.cc"
                  ,0x19);
  }
  return uVar8;
}

Assistant:

int BN_sqrt(BIGNUM *out_sqrt, const BIGNUM *in, BN_CTX *ctx) {
  BIGNUM *estimate, *tmp, *delta, *last_delta, *tmp2;
  int ok = 0, last_delta_valid = 0;

  if (in->neg) {
    OPENSSL_PUT_ERROR(BN, BN_R_NEGATIVE_NUMBER);
    return 0;
  }
  if (BN_is_zero(in)) {
    BN_zero(out_sqrt);
    return 1;
  }

  bssl::BN_CTXScope scope(ctx);
  if (out_sqrt == in) {
    estimate = BN_CTX_get(ctx);
  } else {
    estimate = out_sqrt;
  }
  tmp = BN_CTX_get(ctx);
  last_delta = BN_CTX_get(ctx);
  delta = BN_CTX_get(ctx);
  if (estimate == NULL || tmp == NULL || last_delta == NULL || delta == NULL) {
    goto err;
  }

  // We estimate that the square root of an n-bit number is 2^{n/2}.
  if (!BN_lshift(estimate, BN_value_one(), BN_num_bits(in)/2)) {
    goto err;
  }

  // This is Newton's method for finding a root of the equation |estimate|^2 -
  // |in| = 0.
  for (;;) {
    // |estimate| = 1/2 * (|estimate| + |in|/|estimate|)
    if (!BN_div(tmp, NULL, in, estimate, ctx) ||
        !BN_add(tmp, tmp, estimate) ||
        !BN_rshift1(estimate, tmp) ||
        // |tmp| = |estimate|^2
        !BN_sqr(tmp, estimate, ctx) ||
        // |delta| = |in| - |tmp|
        !BN_sub(delta, in, tmp)) {
      OPENSSL_PUT_ERROR(BN, ERR_R_BN_LIB);
      goto err;
    }

    delta->neg = 0;
    // The difference between |in| and |estimate| squared is required to always
    // decrease. This ensures that the loop always terminates, but I don't have
    // a proof that it always finds the square root for a given square.
    if (last_delta_valid && BN_cmp(delta, last_delta) >= 0) {
      break;
    }

    last_delta_valid = 1;

    tmp2 = last_delta;
    last_delta = delta;
    delta = tmp2;
  }

  if (BN_cmp(tmp, in) != 0) {
    OPENSSL_PUT_ERROR(BN, BN_R_NOT_A_SQUARE);
    goto err;
  }

  ok = 1;

err:
  if (ok && out_sqrt == in && !BN_copy(out_sqrt, estimate)) {
    ok = 0;
  }
  return ok;
}